

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O0

void __thiscall
iDynTree::Triplets::addDiagonalMatrix
          (Triplets *this,size_t startingRow,size_t startingColumn,double value,
          size_t diagonalMatrixSize)

{
  size_type in_RCX;
  long in_RDX;
  long in_RSI;
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *in_RDI;
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *in_XMM0_Qa;
  size_t i;
  value_type *in_stack_ffffffffffffffa8;
  Triplet local_48;
  ulong local_30;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::size(in_RDI);
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve(in_XMM0_Qa,in_RCX);
  for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
    Triplet::Triplet(&local_48,in_RSI + local_30,in_RDX + local_30,(double)in_XMM0_Qa);
    std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::push_back
              (in_RDI,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void Triplets::addDiagonalMatrix(std::size_t startingRow,
                                     std::size_t startingColumn,
                                     double value,
                                     std::size_t diagonalMatrixSize)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + diagonalMatrixSize);
        for (std::size_t i = 0; i < diagonalMatrixSize; ++i) {
            m_triplets.push_back(Triplet(startingRow + i, startingColumn + i, value));
        }
    }